

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall ObjectTest_set_bool_Test::ObjectTest_set_bool_Test(ObjectTest_set_bool_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a21e0;
  return;
}

Assistant:

TEST(ObjectTest, set_bool) {
	object obj;

	obj.set(true);

	EXPECT_TRUE(obj.has<bool>());
	EXPECT_TRUE(obj.get<bool>());
	EXPECT_FALSE(obj.has<int>());
	EXPECT_EQ(obj.get<int>(), 0);

	obj.set(false);

	EXPECT_TRUE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());
	EXPECT_FALSE(obj.has<int>());
	EXPECT_EQ(obj.get<int>(), 0);
}